

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_reverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp_gc_var_t *n_00;
  sexp_gc_var_t *extraout_RDX;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  n_00 = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = (sexp)&DAT_0000023e;
  local_28.next = n_00;
  for (; (((ulong)ls & 3) == 0 && (ls->tag == 6)); ls = (ls->value).type.cpl) {
    local_30 = sexp_cons_op(ctx,self,(sexp_sint_t)n_00,(ls->value).type.name,local_30);
    n_00 = extraout_RDX;
  }
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

sexp sexp_reverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  for (res=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls))
    res = sexp_cons(ctx, sexp_car(ls), res);
  sexp_gc_release1(ctx);
  return res;
}